

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::PausableReadAsyncIoStream::PausableRead::PausableRead
          (PausableRead *this,PromiseFulfiller<unsigned_long> *fulfiller,
          PausableReadAsyncIoStream *parent,void *buffer,size_t minBytes,size_t maxBytes)

{
  SourceLocation location;
  Fault f;
  DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead_&>_&,_const_kj::None_&>
  _kjCondition;
  Fault local_78;
  char *local_70;
  char *pcStack_68;
  undefined8 local_60;
  PromiseFulfiller<unsigned_long> *local_58;
  DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead_&>_&,_const_kj::None_&>
  local_50;
  
  this->fulfiller = fulfiller;
  this->parent = parent;
  this->operationBuffer = buffer;
  this->operationMinBytes = minBytes;
  this->operationMaxBytes = maxBytes;
  tryReadImpl((PausableReadAsyncIoStream *)&local_50,parent,(size_t)buffer,minBytes);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_68 = "PausableRead";
  local_60 = 0x13000016a4;
  location.function = "PausableRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x16a4;
  location.columnNumber = 0x13;
  local_78.exception = (Exception *)fulfiller;
  local_58 = fulfiller;
  Promise<unsigned_long>::
  then<kj::PausableReadAsyncIoStream::PausableRead::PausableRead(kj::PromiseFulfiller<unsigned_long>&,kj::PausableReadAsyncIoStream&,void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::PausableReadAsyncIoStream::PausableRead::PromiseFulfiller(kj::PromiseFulfiller<unsigned_long>&,kj::PausableReadAsyncIoStream&,void*,unsigned_long,unsigned_long)::_lambda(kj::Exception&&)_1_>
            ((Promise<unsigned_long> *)&this->innerRead,
             (anon_class_8_1_a7efefcd_for_func *)&local_50,
             (anon_class_8_1_a7efefcd_for_errorHandler *)&local_78,location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50);
  local_50.left = &parent->maybePausableRead;
  local_50.result = (parent->maybePausableRead).ptr == (PausableRead *)0x0;
  local_50.right = (None *)&kj::none;
  local_50.op.content.ptr = " == ";
  local_50.op.content.size_ = (size_t)&DAT_00000005;
  if (local_50.result) {
    (local_50.left)->ptr = this;
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead&>&,kj::None_const&>&>
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x16ab,FAILED,"parent.maybePausableRead == kj::none","_kjCondition,",&local_50);
  kj::_::Debug::Fault::fatal(&local_78);
}

Assistant:

PausableRead(
      kj::PromiseFulfiller<size_t>& fulfiller, PausableReadAsyncIoStream& parent,
      void* buffer, size_t minBytes, size_t maxBytes)
      : fulfiller(fulfiller), parent(parent),
        operationBuffer(buffer), operationMinBytes(minBytes), operationMaxBytes(maxBytes),
        innerRead(parent.tryReadImpl(operationBuffer, operationMinBytes, operationMaxBytes).then(
            [&fulfiller](size_t size) mutable -> kj::Promise<void> {
          fulfiller.fulfill(kj::mv(size));
          return kj::READY_NOW;
        }, [&fulfiller](kj::Exception&& err) {
          fulfiller.reject(kj::mv(err));
        })) {
    KJ_ASSERT(parent.maybePausableRead == kj::none);
    parent.maybePausableRead = *this;
  }